

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjExporter::~ObjExporter(ObjExporter *this)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer paVar3;
  pointer paVar4;
  
  pcVar1 = (this->endl)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->endl).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::~vector(&this->mMeshes);
  std::
  _Rb_tree<Assimp::ObjExporter::vertexData,_std::pair<const_Assimp::ObjExporter::vertexData,_int>,_std::_Select1st<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>,_Assimp::ObjExporter::vertexDataCompare,_std::allocator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>_>
  ::~_Rb_tree(&(this->mVpMap).vecMap._M_t);
  std::
  _Rb_tree<aiVector3t<float>,_std::pair<const_aiVector3t<float>,_int>,_std::_Select1st<std::pair<const_aiVector3t<float>,_int>_>,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
  ::~_Rb_tree(&(this->mVtMap).vecMap._M_t);
  std::
  _Rb_tree<aiVector3t<float>,_std::pair<const_aiVector3t<float>,_int>,_std::_Select1st<std::pair<const_aiVector3t<float>,_int>_>,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
  ::~_Rb_tree(&(this->mVnMap).vecMap._M_t);
  pvVar2 = (this->vp).
           super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (pointer)0x0) {
    operator_delete(pvVar2);
  }
  paVar3 = (this->vc).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  paVar4 = (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar4 != (pointer)0x0) {
    operator_delete(paVar4);
  }
  paVar4 = (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar4 != (pointer)0x0) {
    operator_delete(paVar4);
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mOutputMat);
  std::ios_base::~ios_base((ios_base *)&this->field_0x1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

ObjExporter::~ObjExporter() {
    // empty
}